

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_xor.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  MakeNet *pMVar1;
  initializer_list<notch::core::LabeledData> samples;
  initializer_list<unsigned_long> __l;
  undefined1 local_260 [16];
  undefined1 local_250 [8];
  _Function_base local_248;
  pointer pMStack_230;
  pointer local_228;
  float *pfStack_220;
  LayerType *local_218;
  LayerType local_208 [2];
  undefined4 *local_200;
  float local_1f8 [2];
  undefined8 *local_1f0;
  LayerType local_1e8 [2];
  undefined4 *local_1e0;
  undefined1 local_1d8 [24];
  undefined4 *local_1c0;
  Array local_1b8;
  undefined8 local_1a8;
  Net xorNet;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_168;
  string local_150;
  string local_130;
  code *local_110 [2];
  code *local_100;
  code *local_f8;
  LabeledDataset dataset;
  LabeledDataset local_a8;
  LabeledDataset local_60;
  
  xorNet._vptr_Net = (_func_int **)0x2;
  xorNet.layers.
  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(8);
  ((xorNet.layers.
    super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<notch::core::ABackpropLayer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_1b8._M_size = 1;
  local_250 = (undefined1  [8])&xorNet;
  local_1b8._M_data = (float *)operator_new(4);
  *local_1b8._M_data = 0.0;
  local_248._M_functor._M_unused._M_object = &local_1b8;
  local_260._0_8_ = 2;
  local_260._8_8_ = operator_new(8);
  local_248._M_functor._8_8_ = local_260;
  *(undefined8 *)local_260._8_8_ = 0x3f80000000000000;
  local_1d8._16_8_ = 1;
  local_1c0 = (undefined4 *)operator_new(4);
  local_248._M_manager = (_Manager_type)(local_1d8 + 0x10);
  *local_1c0 = 0x3f800000;
  local_1d8._0_8_ = 2;
  local_1d8._8_8_ = operator_new(8);
  pMStack_230 = (pointer)local_1d8;
  *(undefined8 *)local_1d8._8_8_ = 0x3f800000;
  local_1e8[0] = Activation;
  local_1e8[1] = FC;
  local_1e0 = (undefined4 *)operator_new(4);
  local_228 = local_1e8;
  *local_1e0 = 0x3f800000;
  local_1f8[0] = 2.8026e-45;
  local_1f8[1] = 0.0;
  local_1f0 = (undefined8 *)operator_new(8);
  pfStack_220 = local_1f8;
  *local_1f0 = 0x3f8000003f800000;
  local_208[0] = Activation;
  local_208[1] = FC;
  local_200 = (undefined4 *)operator_new(4);
  *local_200 = 0;
  local_218 = local_208;
  samples._M_len = 4;
  samples._M_array = (iterator)local_250;
  notch::core::LabeledDataset::LabeledDataset(&dataset,samples);
  operator_delete(local_200);
  operator_delete(local_1f0);
  operator_delete(local_1e0);
  operator_delete((void *)local_1d8._8_8_);
  operator_delete(local_1c0);
  operator_delete((void *)local_260._8_8_);
  operator_delete(local_1b8._M_data);
  operator_delete(xorNet.layers.
                  super__Vector_base<std::shared_ptr<notch::core::ABackpropLayer>,_std::allocator<std::shared_ptr<notch::core::ABackpropLayer>_>_>
                  ._M_impl.super__Vector_impl_data._M_start);
  notch::core::MakeNet::MakeNet((MakeNet *)local_250,0);
  local_1b8._M_size = 2;
  local_1b8._M_data = (float *)0x2;
  local_1a8 = 1;
  __l._M_len = 3;
  __l._M_array = &local_1b8._M_size;
  notch::core::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,__l,
             (allocator_type *)local_260);
  pMVar1 = notch::core::MakeNet::MultilayerPerceptron
                     ((MakeNet *)local_250,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_168,
                      (Activation *)notch::core::scaledTanh);
  pMVar1 = notch::core::MakeNet::addL2Loss(pMVar1);
  local_110[1] = (code *)0x0;
  local_110[0] = notch::core::Init::normalXavier;
  local_f8 = notch::core::std::
             _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
             ::_M_invoke;
  local_100 = notch::core::std::
              _Function_handler<void_(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int),_void_(*)(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>_&,_std::valarray<float>_&,_int,_int)>
              ::_M_manager;
  notch::core::MakeNet::init((MakeNet *)&xorNet,(EVP_PKEY_CTX *)pMVar1);
  notch::core::std::_Function_base::~_Function_base((_Function_base *)local_110);
  notch::core::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&local_168);
  notch::core::MakeNet::~MakeNet((MakeNet *)local_250);
  std::operator<<((ostream *)&std::cout,"training set:\n");
  local_250 = (undefined1  [8])&std::cout;
  notch::io::CSVWriter::operator<<((CSVWriter *)local_250,&dataset);
  std::operator<<((ostream *)&std::cout,"\n");
  std::__cxx11::string::string((string *)&local_130,"initial",(allocator *)local_250);
  notch::core::LabeledDataset::LabeledDataset(&local_60,&dataset);
  print_net(&local_130,&xorNet,&local_60);
  notch::core::LabeledDataset::~LabeledDataset(&local_60);
  std::__cxx11::string::~string((string *)&local_130);
  local_250 = (undefined1  [8])&PTR_update_00126ce8;
  local_248._M_functor._M_unused._M_object = (Array *)0x3f6666663c23d70a;
  local_248._M_functor._8_8_ = local_248._M_functor._8_8_ & 0xffffffff00000000;
  local_248._M_manager = (_Manager_type)0x0;
  pMStack_230 = (pointer)0x0;
  local_228 = (pointer)0x0;
  pfStack_220 = (float *)0x0;
  notch::core::Net::setLearningPolicy(&xorNet,(ALearningPolicy *)local_250);
  notch::core::FixedRate::~FixedRate((FixedRate *)local_250);
  local_250._0_4_ = 100;
  pMStack_230 = (pointer)notch::core::std::
                         _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_xor.cpp:56:32)>
                         ::_M_invoke;
  local_248._M_manager =
       notch::core::std::
       _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/astanin[P]notch/examples/demo_xor.cpp:56:32)>
       ::_M_manager;
  local_248._M_functor._M_unused._M_object = &xorNet;
  local_248._M_functor._8_8_ = &dataset;
  notch::core::SGD::train
            (&xorNet,&dataset,500,(EpochCallback *)local_250,
             (IterationCallback *)notch::core::noIterationCallback);
  notch::core::std::_Function_base::~_Function_base(&local_248);
  std::operator<<((ostream *)&std::cout,"\n");
  std::__cxx11::string::string((string *)&local_150,"final",(allocator *)local_250);
  notch::core::LabeledDataset::LabeledDataset(&local_a8,&dataset);
  print_net(&local_150,&xorNet,&local_a8);
  notch::core::LabeledDataset::~LabeledDataset(&local_a8);
  std::__cxx11::string::~string((string *)&local_150);
  notch::core::Net::~Net(&xorNet);
  notch::core::LabeledDataset::~LabeledDataset(&dataset);
  return 0;
}

Assistant:

int main(int, char *[]) {
    LabeledDataset dataset {{{0,0},{0}},
                            {{0,1},{1}},
                            {{1,0},{1}},
                            {{1,1},{0}}};

    Net xorNet = MakeNet()
        .MultilayerPerceptron({2, 2, 1}, scaledTanh)
        .addL2Loss().init();

    cout << "training set:\n";
    CSVWriter(cout) << dataset;
    cout << "\n";
    print_net("initial", xorNet, dataset);

    xorNet.setLearningPolicy(FixedRate(0.01f /* rate */, 0.9f /* momentum */));
    SGD::train(xorNet, dataset,
               500 /* epochs */,
               EpochCallback { /* every */ 100 /* epochs */,
                /* callback */ [&](int i) {
                   float loss = meanLoss(xorNet, dataset);
                   cout << "epoch " << setw(3) << right << i
                        << " loss = " << setw(10) << left << loss
                        << endl;
                   return false; // don't terminate;
               }});
    cout << "\n";

    print_net("final", xorNet, dataset);
    return 0;
}